

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_construct_destruct_fromCString_valid_fn(int _i)

{
  int iVar1;
  AString *str;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_6;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_5;
  void *_ck_x_4;
  uintmax_t _ck_y;
  uintmax_t _ck_x_3;
  void *_ck_x_2;
  void *_ck_x_1;
  void *_ck_x;
  AString *string;
  int _i_local;
  
  str = AString_constructFromCString("xyz1234567890",3);
  if (str == (AString *)0x0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5d,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) string != NULL","(void*) string"
                      ,0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5d);
  if (str->reallocator == (ACUtilsReallocator)0x0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5e,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) string->reallocator != NULL",
                      "(void*) string->reallocator",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5e);
  if (str->deallocator == (ACUtilsDeallocator)0x0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5f,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) string->deallocator != NULL",
                      "(void*) string->deallocator",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5f);
  if (str->capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x60);
    if (str->buffer == (char *)0x0) {
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x60,"Assertion \'_ck_x != NULL\' failed",
                        "Assertion \'%s\' failed: %s == %#x","(void*) (*string).buffer != NULL",
                        "(void*) (*string).buffer",0,0);
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x60);
    _ck_y_s = str->buffer;
    if (_ck_y_s == (char *)0x0) {
      _ck_y_q = "";
      _ck_y_s = "(null)";
    }
    else {
      _ck_y_q = "\"";
      iVar1 = strcmp("xyz",_ck_y_s);
      if (iVar1 == 0) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x60);
        if (str->size == 3) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x60);
          AString_destruct(str);
          return;
        }
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x60,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(*string).size == strlen(\"xyz\")","(*string).size",str->size,
                          "strlen(\"xyz\")",3,0);
      }
    }
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x60,
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                      "(*string).buffer == (\"xyz\")","(*string).buffer",_ck_y_q,_ck_y_s,_ck_y_q,
                      "(\"xyz\")","\"","xyz","\"",0);
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x60,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju","(*string).capacity == (8)",
                    "(*string).capacity",str->capacity,"(8)",8,0);
}

Assistant:

END_TEST
START_TEST(test_AString_construct_destruct_fromCString_valid)
{
    struct AString *string = AString_constructFromCString("xyz1234567890", 3);
    ACUTILSTEST_ASSERT_PTR_NONNULL(string);
    ACUTILSTEST_ASSERT_PTR_NONNULL(string->reallocator);
    ACUTILSTEST_ASSERT_PTR_NONNULL(string->deallocator);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*string, "xyz", 8);
    AString_destruct(string);
}